

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O1

bool jessilib::apply_cpp_escape_sequences<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inout_string)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  undefined1 *puVar4;
  char *in_RDX;
  char *extraout_RDX;
  ulong uVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char,_std::char_traits<char>_> read_view;
  char *write_head;
  jessilib *local_48;
  pointer local_40;
  char *local_38;
  
  local_48 = (jessilib *)inout_string->_M_string_length;
  if (local_48 == (jessilib *)0x0) {
    bVar8 = true;
  }
  else {
    local_40 = (inout_string->_M_dataplus)._M_p;
    in_string._M_str = in_RDX;
    in_string._M_len = (size_t)local_40;
    local_38 = local_40;
    dVar9 = decode_codepoint_utf8<char>(local_48,in_string);
    bVar8 = dVar9.units == 0;
    if (!bVar8) {
      do {
        in_string_00._M_str = (char *)dVar9.units;
        if (dVar9.codepoint == L'\\') {
          in_string_00._M_len = local_40 + (long)in_string_00._M_str;
          local_48 = local_48 + -(long)in_string_00._M_str;
          local_40 = in_string_00._M_len;
          dVar9 = decode_codepoint_utf8<char>(local_48,in_string_00);
          puVar4 = cpp_escapes_main_tree<char>;
          uVar5 = 0x18;
          do {
            uVar6 = uVar5 >> 1;
            uVar7 = uVar6;
            if ((uint)*(char32_t *)((long)puVar4 + uVar6 * 4 * 4) < (uint)dVar9.codepoint) {
              uVar7 = ~uVar6 + uVar5;
              puVar4 = (undefined1 *)((long)puVar4 + (uVar6 * 4 + 4) * 4);
            }
            uVar5 = uVar7;
          } while (0 < (long)uVar7);
          if ((puVar4 != cpp_escapes_main_tree<char8_t>) && (*(char32_t *)puVar4 == dVar9.codepoint)
             ) {
            local_40 = local_40 + dVar9.units;
            local_48 = local_48 + -dVar9.units;
            cVar2 = (**(code **)((long)puVar4 + 8))(&local_38,&local_48);
            bVar3 = false;
            in_string_00._M_str = extraout_RDX;
            if (cVar2 != '\0') goto LAB_00455afe;
          }
          pcVar1 = (inout_string->_M_dataplus)._M_p;
          in_string_00._M_str = local_38 + -(long)pcVar1;
          if ((char *)inout_string->_M_string_length < in_string_00._M_str) goto LAB_00455b54;
          inout_string->_M_string_length = (size_type)in_string_00._M_str;
          in_string_00._M_str[(long)pcVar1] = '\0';
          bVar3 = true;
        }
        else {
          do {
            *local_38 = *local_40;
            local_38 = local_38 + 1;
            local_40 = local_40 + 1;
            local_48 = local_48 + -1;
            in_string_00._M_str = in_string_00._M_str + -1;
          } while (in_string_00._M_str != (char *)0x0);
          bVar3 = false;
          in_string_00._M_str = (char *)0x0;
        }
LAB_00455afe:
        if (bVar3) {
          return bVar8;
        }
        in_string_01._M_str = in_string_00._M_str;
        in_string_01._M_len = (size_t)local_40;
        dVar9 = decode_codepoint_utf8<char>(local_48,in_string_01);
        bVar8 = dVar9.units == 0;
      } while (!bVar8);
    }
    pcVar1 = (inout_string->_M_dataplus)._M_p;
    uVar5 = (long)local_38 - (long)pcVar1;
    if (inout_string->_M_string_length < uVar5) {
LAB_00455b54:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    inout_string->_M_string_length = uVar5;
    pcVar1[uVar5] = '\0';
  }
  return bVar8;
}

Assistant:

constexpr bool apply_cpp_escape_sequences(std::basic_string<CharT>& inout_string) {
	static_assert(is_sorted<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(), "Tree must be pre-sorted");
	static_assert(is_sorted<CharT, cpp_escapes_main_tree<CharT>, std::size(cpp_escapes_main_tree<CharT>)>(), "Tree must be pre-sorted");

	return apply_shrink_sequence_tree<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(inout_string);
}